

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

void mpp_trie_dump(MppTrie trie,char *func)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 uVar5;
  char *local_e0;
  uint local_c8;
  uint local_c4;
  RK_S32 j;
  RK_S32 valid_count;
  MppTrieNode *node;
  RK_S32 tag_len [17];
  uint local_68 [2];
  RK_S32 next_cnt [17];
  RK_S32 i;
  MppTrieImpl *p;
  char *func_local;
  MppTrie trie_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  unique0x10000434 = (undefined8 *)trie;
  memset(local_68,0,0x44);
  memset(&node,0,0x44);
  _mpp_log_l(4,"mpp_trie","%s dumping trie %p\n",(char *)0x0,func,trie);
  iVar4 = *(int *)((long)stack0xffffffffffffffe0 + 0x2c);
  local_e0 = (char *)CONCAT44(uVar5,*(undefined4 *)(stack0xffffffffffffffe0 + 3));
  _mpp_log_l(4,"mpp_trie","name %s size %d node %d info %d\n",(char *)0x0,*stack0xffffffffffffffe0,
             (ulong)*(uint *)((long)stack0xffffffffffffffe0 + 0xc),iVar4,local_e0);
  for (next_cnt[0xf] = 0; next_cnt[0xf] < *(int *)((long)stack0xffffffffffffffe0 + 0x2c);
      next_cnt[0xf] = next_cnt[0xf] + 1) {
    lVar3 = stack0xffffffffffffffe0[6] + (long)next_cnt[0xf] * 0x38;
    local_c4 = 0;
    if ((next_cnt[0xf] == 0) || (*(short *)(lVar3 + 0x24) != 0)) {
      if (*(int *)(lVar3 + 0x20) < 0) {
        _mpp_log_l(4,"mpp_trie","node %d key %x\n",(char *)0x0,
                   (ulong)(uint)(int)*(short *)(lVar3 + 0x24),(ulong)*(ushort *)(lVar3 + 0x30),iVar4
                   ,local_e0);
      }
      else if (*(int *)(lVar3 + 0x20) < *(int *)((long)stack0xffffffffffffffe0 + 0x2c) * 0x38) {
        sVar1 = *(short *)(lVar3 + 0x24);
        uVar2 = *(ushort *)(lVar3 + 0x30);
        iVar4 = *(int *)(lVar3 + 0x20);
        if (stack0xffffffffffffffe0[8] == 0) {
          local_e0 = mpp_trie_info_name((MppTrieInfo *)
                                        (stack0xffffffffffffffe0[6] + (long)*(int *)(lVar3 + 0x20)))
          ;
        }
        else {
          local_e0 = (char *)(stack0xffffffffffffffe0[8] +
                             (long)*(int *)(stack0xffffffffffffffe0[4] +
                                            (long)*(int *)(lVar3 + 0x20) * 0x14 + 0x10));
        }
        _mpp_log_l(4,"mpp_trie","node %d key %x info %d - %s\n",(char *)0x0,(ulong)(uint)(int)sVar1,
                   (ulong)uVar2,iVar4,local_e0);
      }
      else {
        sVar1 = *(short *)(lVar3 + 0x24);
        uVar2 = *(ushort *)(lVar3 + 0x30);
        iVar4 = *(int *)(lVar3 + 0x20);
        local_e0 = mpp_trie_info_name((MppTrieInfo *)
                                      (stack0xffffffffffffffe0[6] + (long)*(int *)(lVar3 + 0x20)));
        _mpp_log_l(4,"mpp_trie","node %d key %x info %d - %s\n",(char *)0x0,(ulong)(uint)(int)sVar1,
                   (ulong)uVar2,iVar4,local_e0);
      }
      if (*(short *)(lVar3 + 0x32) == 0) {
        _mpp_log_l(4,"mpp_trie","    prev %d count %d\n",(char *)0x0,
                   (ulong)(uint)(int)*(short *)(lVar3 + 0x26),(ulong)*(ushort *)(lVar3 + 0x34),iVar4
                   ,local_e0);
      }
      else {
        iVar4 = (int)*(short *)(lVar3 + 0x32);
        local_e0 = *(char **)(lVar3 + 0x28);
        _mpp_log_l(4,"mpp_trie","    prev %d count %d tag %d - %llx\n",(char *)0x0,
                   (ulong)(uint)(int)*(short *)(lVar3 + 0x26),(ulong)*(ushort *)(lVar3 + 0x34),iVar4
                   ,local_e0);
      }
      for (local_c8 = 0; (int)local_c8 < 0x10; local_c8 = local_c8 + 1) {
        if (0 < *(short *)(lVar3 + (long)(int)local_c8 * 2)) {
          iVar4 = (int)*(short *)(lVar3 + (long)(int)local_c8 * 2);
          _mpp_log_l(4,"mpp_trie","    next %d:%d -> %d\n",(char *)0x0,(ulong)local_c4,
                     (ulong)local_c8,iVar4,local_e0);
          local_c4 = local_c4 + 1;
        }
      }
      next_cnt[(long)(int)local_c4 + -2] = next_cnt[(long)(int)local_c4 + -2] + 1;
      tag_len[(long)*(short *)(lVar3 + 0x32) + -2] =
           tag_len[(long)*(short *)(lVar3 + 0x32) + -2] + 1;
    }
  }
  _mpp_log_l(4,"mpp_trie","node | next |  tag | used %d\n",(char *)0x0,
             (ulong)*(uint *)((long)stack0xffffffffffffffe0 + 0x2c));
  for (next_cnt[0xf] = 0; next_cnt[0xf] < 0x11; next_cnt[0xf] = next_cnt[0xf] + 1) {
    if ((next_cnt[(long)next_cnt[0xf] + -2] != 0) || (tag_len[(long)next_cnt[0xf] + -2] != 0)) {
      _mpp_log_l(4,"mpp_trie","%2d   | %4d | %4d |\n",(char *)0x0,(ulong)(uint)next_cnt[0xf],
                 (ulong)(uint)next_cnt[(long)next_cnt[0xf] + -2],tag_len[(long)next_cnt[0xf] + -2]);
    }
  }
  _mpp_log_l(4,"mpp_trie","%s dumping node end\n",(char *)0x0,func);
  return;
}

Assistant:

void mpp_trie_dump(MppTrie trie, const char *func)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    RK_S32 i;
    RK_S32 next_cnt[17];
    RK_S32 tag_len[17];

    memset(next_cnt, 0, sizeof(next_cnt));
    memset(tag_len, 0, sizeof(tag_len));

    mpp_logi("%s dumping trie %p\n", func, trie);
    mpp_logi("name %s size %d node %d info %d\n",
             p->name, p->buf_size, p->node_used, p->info_used);

    for (i = 0; i < p->node_used; i++) {
        MppTrieNode *node = &p->nodes[i];
        RK_S32 valid_count = 0;
        RK_S32 j;

        if (i && !node->idx)
            continue;

        if (node->id >= 0) {
            /* check before and after last info */
            if (node->id < (RK_S32)(p->node_used * sizeof(MppTrieNode)))
                mpp_logi("node %d key %x info %d - %s\n", node->idx, node->key, node->id,
                         p->name_buf ? ((char *)p->name_buf + p->info[node->id].name_offset) :
                         mpp_trie_info_name(((MppTrieInfo *)((char *)p->nodes + node->id))));
            else
                mpp_logi("node %d key %x info %d - %s\n", node->idx, node->key, node->id,
                         mpp_trie_info_name(((MppTrieInfo *)((char *)p->nodes + node->id))));
        } else
            mpp_logi("node %d key %x\n", node->idx, node->key);

        if (node->tag_len)
            mpp_logi("    prev %d count %d tag %d - %llx\n", node->prev, node->next_cnt, node->tag_len, node->tag_val);
        else
            mpp_logi("    prev %d count %d\n", node->prev, node->next_cnt);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (node->next[j] > 0) {
                mpp_logi("    next %d:%d -> %d\n", valid_count, j, node->next[j]);
                valid_count++;
            }
        }

        next_cnt[valid_count]++;
        tag_len[node->tag_len]++;
    }

    mpp_logi("node | next |  tag | used %d\n", p->node_used);

    for (i = 0; i < 17; i++) {
        if (next_cnt[i] || tag_len[i])
            mpp_logi("%2d   | %4d | %4d |\n", i, next_cnt[i], tag_len[i]);
    }

    mpp_logi("%s dumping node end\n", func);
}